

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O0

UChar * u_strrchr32_63(UChar *s,UChar32 c)

{
  UChar *pUVar1;
  UChar trail;
  UChar lead;
  UChar *pUStack_28;
  UChar cs;
  UChar *result;
  UChar *pUStack_18;
  UChar32 c_local;
  UChar *s_local;
  
  if ((uint)c < 0x10000) {
    s_local = u_strrchr_63(s,(UChar)c);
  }
  else if ((uint)c < 0x110000) {
    pUStack_28 = (UChar *)0x0;
    pUVar1 = s;
    while( true ) {
      pUStack_18 = pUVar1;
      pUVar1 = pUStack_18 + 1;
      if (*pUStack_18 == L'\0') break;
      if ((*pUStack_18 == (UChar)((short)(c >> 10) + L'ퟀ')) &&
         (*pUVar1 == ((UChar)c & 0x3ffU | 0xdc00U))) {
        pUStack_28 = pUStack_18;
      }
    }
    s_local = pUStack_28;
  }
  else {
    s_local = (UChar *)0x0;
  }
  return s_local;
}

Assistant:

U_CAPI UChar * U_EXPORT2
u_strrchr32(const UChar *s, UChar32 c) {
    if((uint32_t)c<=U_BMP_MAX) {
        /* find BMP code point */
        return u_strrchr(s, (UChar)c);
    } else if((uint32_t)c<=UCHAR_MAX_VALUE) {
        /* find supplementary code point as surrogate pair */
        const UChar *result=NULL;
        UChar cs, lead=U16_LEAD(c), trail=U16_TRAIL(c);

        while((cs=*s++)!=0) {
            if(cs==lead && *s==trail) {
                result=s-1;
            }
        }
        return (UChar *)result;
    } else {
        /* not a Unicode code point, not findable */
        return NULL;
    }
}